

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

string * __thiscall
cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem
          (string *__return_storage_ptr__,FeatureDescriptor *this,string *library,ItemIsPath isPath)

{
  string *psVar1;
  string *local_98;
  undefined1 local_68 [8];
  FeaturePlaceHolderExpander expander;
  string format;
  ItemIsPath isPath_local;
  string *library_local;
  FeatureDescriptor *this_local;
  
  if (isPath == Yes) {
    local_98 = (string *)&this->ItemPathFormat;
  }
  else {
    local_98 = (string *)&this->ItemNameFormat;
  }
  std::__cxx11::string::string((string *)&expander.LinkItem,local_98);
  anon_unknown.dwarf_14f6153::FeaturePlaceHolderExpander::FeaturePlaceHolderExpander
            ((FeaturePlaceHolderExpander *)local_68,library,library,library);
  psVar1 = cmPlaceholderExpander::ExpandVariables
                     ((cmPlaceholderExpander *)local_68,(string *)&expander.LinkItem);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  anon_unknown.dwarf_14f6153::FeaturePlaceHolderExpander::~FeaturePlaceHolderExpander
            ((FeaturePlaceHolderExpander *)local_68);
  std::__cxx11::string::~string((string *)&expander.LinkItem);
  return __return_storage_ptr__;
}

Assistant:

std::string cmComputeLinkInformation::FeatureDescriptor::GetDecoratedItem(
  std::string const& library, ItemIsPath isPath) const
{
  auto format =
    isPath == ItemIsPath::Yes ? this->ItemPathFormat : this->ItemNameFormat;

  // replace <LIBRARY>, <LIB_ITEM> and <LINK_ITEM> patterns with library path
  FeaturePlaceHolderExpander expander(&library, &library, &library);
  return expander.ExpandVariables(format);
}